

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O3

int fl_XGetUtf8FontAndGlyph(XUtf8FontStruct *font_set,uint ucs,XFontStruct **fnt,unsigned_short *id)

{
  uint uVar1;
  int enc;
  XFontStruct **ppXVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  char glyph [2];
  ushort local_52;
  int *local_50;
  int *local_48;
  ushort *local_40;
  XFontStruct **local_38;
  
  uVar1 = font_set->nb_font;
  if ((int)uVar1 < 1) {
    return -1;
  }
  local_50 = font_set->ranges;
  local_48 = font_set->encodings;
  ppXVar2 = font_set->fonts;
  uVar4 = 0;
  while (ppXVar2[uVar4] == (XFontStruct *)0x0) {
    uVar4 = uVar4 + 1;
    if (uVar1 == uVar4) {
      return -1;
    }
  }
  uVar6 = uVar4;
  local_40 = id;
  local_38 = fnt;
  if ((int)(uint)uVar4 < (int)uVar1) {
    do {
      if (ppXVar2[uVar6] != (XFontStruct *)0x0) {
        enc = local_48[uVar6];
        iVar3 = ucs2fontmap((char *)&local_52,ucs,enc);
        if ((-1 < iVar3) &&
           ((enc != 0 ||
            ((local_50[uVar6 * 2] <= (int)ucs && ((int)ucs <= local_50[uVar6 * 2 + 1]))))))
        goto LAB_001a623d;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  else {
    uVar6 = uVar4 & 0xffffffff;
LAB_001a623d:
    uVar5 = (uint)uVar6;
    if (uVar5 != uVar1) goto LAB_001a625c;
  }
  ucs2fontmap((char *)&local_52,0x3f,local_48[uVar4]);
  uVar5 = (uint)uVar4;
LAB_001a625c:
  *local_40 = local_52 << 8 | local_52 >> 8;
  *local_38 = ppXVar2[(int)uVar5];
  return 0;
}

Assistant:

int
fl_XGetUtf8FontAndGlyph(XUtf8FontStruct  *font_set,
			unsigned int     ucs,
			XFontStruct      **fnt,
			unsigned short   *id) {

  int             *encodings; /* encodings array */
  XFontStruct     **fonts;    /* fonts array */
  int             fnum;       /* index of the current font in the fonts array*/
  int             first;      /* first valid font index */
  int             nb_font;    /* quantity of fonts in the font array */
  char 		  glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int             *ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return -1;
  }

  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return -1;
  }

  first = fnum;

  /*
   * find the first encoding which can be used to draw the glyph
   */
  fnum = first;
  while (fnum < nb_font) {
    if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
      if (encodings[fnum] != 0 ||
          ((int)ucs >= ranges[fnum * 2] &&
	   (int)ucs <= ranges[fnum * 2 + 1])) {
	break;
      }
    }
    fnum++;
  }
  if (fnum == nb_font) {
    /* the char is not valid in all encodings ->
     * draw it using the first font :-(
     */
    fnum = first;
    ucs2fontmap(glyph, '?', encodings[fnum]);
  }

  *id = ((unsigned char)glyph[0] << 8) | (unsigned char)glyph[1] ;
  *fnt = fonts[fnum];
  return 0;
}